

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O2

longlong __thiscall QPDFObjectHandle::getIntValue(QPDFObjectHandle *this)

{
  QPDF_Integer *pQVar1;
  longlong lVar2;
  allocator<char> local_31;
  string local_30;
  
  pQVar1 = ::qpdf::BaseHandle::as<QPDF_Integer>(&this->super_BaseHandle);
  if (pQVar1 == (QPDF_Integer *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"returning 0",&local_31);
    typeWarning(this,"integer",&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    lVar2 = 0;
  }
  else {
    lVar2 = pQVar1->val;
  }
  return lVar2;
}

Assistant:

long long
QPDFObjectHandle::getIntValue() const
{
    if (auto integer = as<QPDF_Integer>()) {
        return integer->val;
    } else {
        typeWarning("integer", "returning 0");
        QTC::TC("qpdf", "QPDFObjectHandle integer returning 0");
        return 0;
    }
}